

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderEms.cpp
# Opt level: O1

FilereaderRetcode __thiscall
FilereaderEms::readModelFromFile
          (FilereaderEms *this,HighsOptions *options,string *filename,HighsModel *model)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *this_02;
  int *piVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  string *psVar7;
  FilereaderRetcode FVar8;
  char *format;
  long lVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  long lVar11;
  HighsInt numCol;
  HighsInt numRow;
  HighsInt AcountX;
  string line;
  HighsInt num_int;
  HighsInt iCol;
  ifstream f;
  undefined1 auStack_298 [8];
  HighsInt local_290;
  HighsInt local_28c;
  HighsModel *local_288;
  int local_27c;
  string local_278;
  int local_254;
  value_type_conflict1 local_250;
  HighsSparseMatrix *local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_240;
  undefined1 local_238 [520];
  
  std::ifstream::ifstream((string *)local_238);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)filename);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    FVar8 = kFileNotFound;
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,"EMS file not found\n");
    goto LAB_001ef8b3;
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  local_288 = model;
  cVar5 = std::ios::widen((char)(string *)local_238 + (char)*(_func_int **)(local_238._0_8_ + -0x18)
                         );
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_278,cVar5);
  psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
  iVar6 = std::__cxx11::string::compare((char *)psVar7);
  local_240 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(local_240._4_4_,iVar6);
  if (iVar6 != 0) {
    while( true ) {
      psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      if ((iVar6 == 0) ||
         (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) != 0))
      break;
      cVar5 = std::ios::widen((char)auStack_298 + (char)*(_func_int **)(local_238._0_8_ + -0x18) +
                              '`');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar5);
    }
  }
  if (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) == 0) {
    std::istream::operator>>(local_238,&local_28c);
    cVar5 = std::ios::widen((char)local_238 + (char)*(_func_int **)(local_238._0_8_ + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_278,cVar5);
    while( true ) {
      psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      if (iVar6 != 0) break;
      cVar5 = std::ios::widen((char)*(_func_int **)(local_238._0_8_ + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar5);
    }
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 != 0) {
      format = "n_columns not found in EMS file\n";
      goto LAB_001ef881;
    }
    std::istream::operator>>(local_238,&local_290);
    cVar5 = std::ios::widen((char)local_238 + (char)*(_func_int **)(local_238._0_8_ + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_278,cVar5);
    while( true ) {
      psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      if (iVar6 != 0) break;
      cVar5 = std::ios::widen((char)*(_func_int **)(local_238._0_8_ + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar5);
    }
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 != 0) {
      format = "n_matrix_elements not found in EMS file\n";
      goto LAB_001ef881;
    }
    std::istream::operator>>(local_238,&local_27c);
    (local_288->lp_).num_col_ = local_290;
    (local_288->lp_).num_row_ = local_28c;
    cVar5 = std::ios::widen((char)local_238 + (char)*(_func_int **)(local_238._0_8_ + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_278,cVar5);
    while( true ) {
      psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      cVar5 = (char)(istream *)local_238;
      if (iVar6 != 0) break;
      cVar5 = std::ios::widen((char)*(_func_int **)(local_238._0_8_ + -0x18) + cVar5);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar5);
    }
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 != 0) {
      format = "matrix not found in EMS file\n";
      goto LAB_001ef881;
    }
    (local_288->lp_).a_matrix_.format_ = kColwise;
    this_00 = &(local_288->lp_).a_matrix_.start_;
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)local_290 + 1);
    this_01 = &(local_288->lp_).a_matrix_.index_;
    std::vector<int,_std::allocator<int>_>::resize(this_01,(long)local_27c);
    local_248 = (HighsSparseMatrix *)&(local_288->lp_).a_matrix_.value_;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)local_248,(long)local_27c);
    if (-1 < local_290) {
      lVar9 = 0;
      do {
        std::istream::operator>>
                  (local_238,
                   (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar9);
        if ((int)local_240 != 0) {
          piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar9;
          *piVar3 = *piVar3 + -1;
        }
        bVar4 = lVar9 < local_290;
        lVar9 = lVar9 + 1;
      } while (bVar4);
    }
    if (0 < local_27c) {
      lVar9 = 0;
      lVar11 = 0;
      do {
        std::istream::operator>>
                  (local_238,
                   (int *)((long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar9));
        if ((int)local_240 != 0) {
          piVar3 = (int *)((long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar9);
          *piVar3 = *piVar3 + -1;
        }
        lVar11 = lVar11 + 1;
        lVar9 = lVar9 + 4;
      } while (lVar11 < local_27c);
    }
    if (0 < local_27c) {
      lVar9 = 0;
      do {
        std::istream::_M_extract<double>((double *)local_238);
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_27c);
    }
    cVar5 = std::ios::widen(cVar5 + (char)*(_func_int **)(local_238._0_8_ + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_278,cVar5);
    local_248 = &(local_288->lp_).a_matrix_;
    while( true ) {
      psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      if (iVar6 != 0) break;
      cVar5 = std::ios::widen((char)*(_func_int **)(local_238._0_8_ + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar5);
    }
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 != 0) {
      format = "column_bounds not found in EMS file\n";
      goto LAB_001ef881;
    }
    pvVar1 = &(local_288->lp_).col_lower_;
    std::vector<double,_std::allocator<double>_>::reserve(pvVar1,(long)local_290);
    pvVar2 = &(local_288->lp_).col_upper_;
    std::vector<double,_std::allocator<double>_>::reserve(pvVar2,(long)local_290);
    local_250 = -INFINITY;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(pvVar1,(long)local_290,&local_250);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (pvVar2,(long)local_290,(value_type_conflict1 *)&kHighsInf);
    if (0 < local_290) {
      lVar9 = 0;
      do {
        std::istream::_M_extract<double>((double *)local_238);
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_290);
    }
    if (0 < local_290) {
      lVar9 = 0;
      do {
        std::istream::_M_extract<double>((double *)local_238);
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_290);
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_278);
    while( true ) {
      psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      if (iVar6 != 0) break;
      cVar5 = std::ios::widen((char)*(_func_int **)(local_238._0_8_ + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar5);
    }
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 != 0) {
      format = "row_bounds not found in EMS file\n";
      goto LAB_001ef881;
    }
    pvVar1 = &(local_288->lp_).row_lower_;
    std::vector<double,_std::allocator<double>_>::reserve(pvVar1,(long)local_28c);
    pvVar2 = &(local_288->lp_).row_upper_;
    std::vector<double,_std::allocator<double>_>::reserve(pvVar2,(long)local_28c);
    local_250 = -INFINITY;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(pvVar1,(long)local_28c,&local_250);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (pvVar2,(long)local_28c,(value_type_conflict1 *)&kHighsInf);
    if (0 < local_28c) {
      lVar9 = 0;
      do {
        std::istream::_M_extract<double>((double *)local_238);
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_28c);
    }
    if (0 < local_28c) {
      lVar9 = 0;
      do {
        std::istream::_M_extract<double>((double *)local_238);
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_28c);
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_278);
    while( true ) {
      psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      if (iVar6 != 0) break;
      cVar5 = std::ios::widen((char)*(_func_int **)(local_238._0_8_ + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar5);
    }
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 != 0) {
      format = "column_costs not found in EMS file\n";
      goto LAB_001ef881;
    }
    pvVar1 = &(local_288->lp_).col_cost_;
    std::vector<double,_std::allocator<double>_>::reserve(pvVar1,(long)local_290);
    local_250 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(pvVar1,(long)local_290,&local_250);
    if (0 < local_290) {
      lVar9 = 0;
      do {
        std::istream::_M_extract<double>((double *)local_238);
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_290);
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_278);
    while( true ) {
      psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      if ((iVar6 != 0) ||
         (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) != 0))
      break;
      cVar5 = std::ios::widen((char)auStack_298 + (char)*(_func_int **)(local_238._0_8_ + -0x18) +
                              '`');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar5);
    }
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 == 0) {
      std::istream::operator>>(local_238,&local_254);
      if (local_254 != 0) {
        this_02 = &(local_288->lp_).integrality_;
        local_250 = (value_type_conflict1)((ulong)local_250 & 0xffffffffffffff00);
        std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
                  (this_02,(long)(local_288->lp_).num_col_,(value_type *)&local_250);
        if (0 < local_254) {
          iVar6 = 0;
          do {
            std::istream::operator>>(local_238,(int *)&local_250);
            if ((int)local_240 != 0) {
              local_250 = (value_type_conflict1)CONCAT44(local_250._4_4_,local_250._0_4_ + -1);
            }
            (this_02->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
            super__Vector_impl_data._M_start[local_250._0_4_] = kInteger;
            iVar6 = iVar6 + 1;
          } while (iVar6 < local_254);
        }
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278);
      while( true ) {
        psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
        iVar6 = std::__cxx11::string::compare((char *)psVar7);
        if ((iVar6 != 0) ||
           (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) != 0))
        break;
        cVar5 = std::ios::widen((char)auStack_298 + (char)*(_func_int **)(local_238._0_8_ + -0x18) +
                                '`');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_278,cVar5);
      }
    }
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 == 0) {
      std::ifstream::close();
      HighsSparseMatrix::ensureColwise(local_248);
    }
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 != 0) {
      format = "names not found in EMS file\n";
      if (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) != 0) {
        HighsSparseMatrix::ensureColwise(local_248);
      }
      goto LAB_001ef881;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_278);
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 != 0) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278);
    }
    psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
    iVar6 = std::__cxx11::string::compare((char *)psVar7);
    if (iVar6 == 0) {
      local_240 = &(local_288->lp_).row_names_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(local_240,(long)local_28c);
      pvVar10 = &(local_288->lp_).col_names_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(pvVar10,(long)local_290);
      if (0 < local_290) {
        lVar11 = 0;
        lVar9 = 0;
        do {
          cVar5 = std::ios::widen((char)*(_func_int **)(local_238._0_8_ + -0x18) +
                                  (char)(istream *)local_238);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_238,(string *)&local_278,cVar5);
          trim(&local_278,&default_non_chars_abi_cxx11_);
          std::__cxx11::string::_M_assign
                    ((string *)
                     ((long)&(((pvVar10->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar11));
          lVar9 = lVar9 + 1;
          lVar11 = lVar11 + 0x20;
        } while (lVar9 < local_290);
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278);
      psVar7 = trim(&local_278,&default_non_chars_abi_cxx11_);
      iVar6 = std::__cxx11::string::compare((char *)psVar7);
      pvVar10 = local_240;
      if (iVar6 == 0) {
        if (0 < local_28c) {
          lVar11 = 0;
          lVar9 = 0;
          do {
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_238,(string *)&local_278);
            trim(&local_278,&default_non_chars_abi_cxx11_);
            std::__cxx11::string::_M_assign
                      ((string *)
                       ((long)&(((pvVar10->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar11));
            lVar9 = lVar9 + 1;
            lVar11 = lVar11 + 0x20;
          } while (lVar9 < local_28c);
        }
        std::ifstream::close();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        FVar8 = kOk;
        HighsSparseMatrix::ensureColwise(local_248);
        goto LAB_001ef8b3;
      }
    }
  }
  else {
    format = "n_rows not found in EMS file\n";
LAB_001ef881:
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,format);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  FVar8 = kParserError;
LAB_001ef8b3:
  std::ifstream::~ifstream(local_238);
  return FVar8;
}

Assistant:

FilereaderRetcode FilereaderEms::readModelFromFile(const HighsOptions& options,
                                                   const std::string filename,
                                                   HighsModel& model) {
  std::ifstream f;
  HighsInt i;

  HighsLp& lp = model.lp_;
  f.open(filename, std::ios::in);
  if (f.is_open()) {
    std::string line;
    HighsInt numCol, numRow, AcountX, num_int;
    bool indices_from_one = false;

    // counts
    std::getline(f, line);
    if (trim(line) != "n_rows") {
      while (trim(line) != "n_rows" && f) std::getline(f, line);
      indices_from_one = true;
    }
    if (!f) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "n_rows not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f >> numRow;

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "n_columns") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "n_columns not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f >> numCol;

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "n_matrix_elements") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "n_matrix_elements not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f >> AcountX;

    lp.num_col_ = numCol;
    lp.num_row_ = numRow;

    // matrix
    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "matrix") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "matrix not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.a_matrix_.format_ = MatrixFormat::kColwise;
    lp.a_matrix_.start_.resize(numCol + 1);
    lp.a_matrix_.index_.resize(AcountX);
    lp.a_matrix_.value_.resize(AcountX);

    for (i = 0; i < numCol + 1; i++) {
      f >> lp.a_matrix_.start_[i];
      if (indices_from_one) lp.a_matrix_.start_[i]--;
    }

    for (i = 0; i < AcountX; i++) {
      f >> lp.a_matrix_.index_[i];
      if (indices_from_one) lp.a_matrix_.index_[i]--;
    }

    for (i = 0; i < AcountX; i++) f >> lp.a_matrix_.value_[i];

    // cost and bounds
    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "column_bounds") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "column_bounds not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.col_lower_.reserve(numCol);
    lp.col_upper_.reserve(numCol);

    lp.col_lower_.assign(numCol, -kHighsInf);
    lp.col_upper_.assign(numCol, kHighsInf);

    for (i = 0; i < numCol; i++) {
      f >> lp.col_lower_[i];
    }

    for (i = 0; i < numCol; i++) {
      f >> lp.col_upper_[i];
    }

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "row_bounds") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "row_bounds not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.row_lower_.reserve(numRow);
    lp.row_upper_.reserve(numRow);
    lp.row_lower_.assign(numRow, -kHighsInf);
    lp.row_upper_.assign(numRow, kHighsInf);

    for (i = 0; i < numRow; i++) {
      f >> lp.row_lower_[i];
    }

    for (i = 0; i < numRow; i++) {
      f >> lp.row_upper_[i];
    }

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "column_costs") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "column_costs not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.col_cost_.reserve(numCol);
    lp.col_cost_.assign(numCol, 0);
    for (i = 0; i < numCol; i++) {
      f >> lp.col_cost_[i];
    }

    // Get the next keyword
    std::getline(f, line);
    while (trim(line) == "" && f) std::getline(f, line);

    if (trim(line) == "integer_columns") {
      f >> num_int;
      if (num_int) {
        lp.integrality_.resize(lp.num_col_, HighsVarType::kContinuous);
        HighsInt iCol;
        for (i = 0; i < num_int; i++) {
          f >> iCol;
          if (indices_from_one) iCol--;
          lp.integrality_[iCol] = HighsVarType::kInteger;
        }
      }
      // Get the next keyword. If there's no integer_columns section
      // then it will already have been read
      std::getline(f, line);
      while (trim(line) == "" && f) std::getline(f, line);
    }

    // Act if the next keyword is end_linear
    if (trim(line) == "end_linear") {
      // File read completed OK
      f.close();
      lp.ensureColwise();
    }

    // Act if the next keyword is names
    if (trim(line) == "names") {
      // Ignore length since we support any length.
      std::getline(f, line);
      if (trim(line) != "columns") std::getline(f, line);
      if (trim(line) != "columns") return FilereaderRetcode::kParserError;

      lp.row_names_.resize(numRow);
      lp.col_names_.resize(numCol);

      for (i = 0; i < numCol; i++) {
        std::getline(f, line);
        lp.col_names_[i] = trim(line);
      }

      std::getline(f, line);
      if (trim(line) != "rows") return FilereaderRetcode::kParserError;

      for (i = 0; i < numRow; i++) {
        std::getline(f, line);
        lp.row_names_[i] = trim(line);
      }
    } else {
      // OK if file just ends after the integer_columns section without
      // end_linear
      if (!f) lp.ensureColwise();
      highsLogUser(options.log_options, HighsLogType::kError,
                   "names not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f.close();
  } else {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "EMS file not found\n");
    return FilereaderRetcode::kFileNotFound;
  }
  lp.ensureColwise();
  return FilereaderRetcode::kOk;
}